

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O0

void __thiscall YAML::Scanner::ScanAnchorOrAlias(Scanner *this)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  undefined8 uVar4;
  Mark *mark_;
  char *pcVar5;
  int iVar6;
  Stream *in_RDI;
  Token token;
  char indicator;
  Mark mark;
  string name;
  bool alias;
  Stream *in_stack_fffffffffffffe38;
  Stream *in_stack_fffffffffffffe40;
  string *msg_;
  Mark *in_stack_fffffffffffffe48;
  TYPE type_;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  bool local_14f;
  string local_120 [64];
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  _Alloc_hider in_stack_ffffffffffffff27;
  string local_d8 [32];
  Mark local_b8;
  Mark local_a8;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  Mark local_78;
  Mark local_68;
  char local_59;
  Mark local_58;
  Mark local_48;
  string local_30 [39];
  byte local_9;
  
  std::__cxx11::string::string(local_30);
  InsertPotentialSimpleKey
            ((Scanner *)
             CONCAT17(in_stack_ffffffffffffff27,
                      CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)));
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3a = 0;
  in_RDI[1].m_readahead.super__Deque_base<char,_std::allocator<char>_>._M_impl.field_0x3b = 0;
  local_58 = YAML::Stream::mark(in_RDI);
  local_48 = local_58;
  local_59 = YAML::Stream::get(in_stack_fffffffffffffe40);
  local_9 = local_59 == '*';
  while( true ) {
    bVar1 = YAML::Stream::operator_cast_to_bool
                      ((Stream *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    local_14f = false;
    if (bVar1) {
      Exp::Anchor();
      local_14f = RegEx::Matches((RegEx *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    }
    if (local_14f == false) break;
    cVar2 = YAML::Stream::get(in_stack_fffffffffffffe40);
    std::__cxx11::string::operator+=(local_30,cVar2);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    local_9a = 1;
    uVar4 = __cxa_allocate_exception(0x40);
    local_78 = YAML::Stream::mark(in_RDI);
    pcVar5 = "anchor not found after &";
    if ((local_9 & 1) != 0) {
      pcVar5 = "alias not found after *";
    }
    local_68 = local_78;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,pcVar5,&local_99);
    ParserException::ParserException
              ((ParserException *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe48,(string *)in_stack_fffffffffffffe40);
    local_9a = 0;
    __cxa_throw(uVar4,&ParserException::typeinfo,ParserException::~ParserException);
  }
  bVar1 = YAML::Stream::operator_cast_to_bool
                    ((Stream *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  type_ = (TYPE)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  if (bVar1) {
    Exp::AnchorEnd();
    bVar1 = RegEx::Matches((RegEx *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    if (!bVar1) {
      mark_ = (Mark *)__cxa_allocate_exception(0x40);
      local_b8 = YAML::Stream::mark(in_RDI);
      iVar6 = local_b8.column;
      pcVar5 = "illegal character found while scanning anchor";
      if ((local_9 & 1) != 0) {
        pcVar5 = "illegal character found while scanning alias";
      }
      msg_ = (string *)&stack0xffffffffffffff27;
      local_a8 = local_b8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,pcVar5,(allocator *)msg_);
      ParserException::ParserException
                ((ParserException *)CONCAT44(iVar6,in_stack_fffffffffffffe50),mark_,msg_);
      __cxa_throw(mark_,&ParserException::typeinfo,ParserException::~ParserException);
    }
  }
  Token::Token((Token *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),type_,
               (Mark *)in_stack_fffffffffffffe40);
  std::__cxx11::string::operator=(local_120,local_30);
  std::queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_>::push
            ((queue<YAML::Token,_std::deque<YAML::Token,_std::allocator<YAML::Token>_>_> *)
             in_stack_fffffffffffffe40,(value_type *)in_stack_fffffffffffffe38);
  Token::~Token((Token *)in_stack_fffffffffffffe40);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Scanner::ScanAnchorOrAlias() {
  bool alias;
  std::string name;

  // insert a potential simple key
  InsertPotentialSimpleKey();
  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = false;

  // eat the indicator
  Mark mark = INPUT.mark();
  char indicator = INPUT.get();
  alias = (indicator == Keys::Alias);

  // now eat the content
  while (INPUT && Exp::Anchor().Matches(INPUT))
    name += INPUT.get();

  // we need to have read SOMETHING!
  if (name.empty())
    throw ParserException(INPUT.mark(), alias ? ErrorMsg::ALIAS_NOT_FOUND
                                              : ErrorMsg::ANCHOR_NOT_FOUND);

  // and needs to end correctly
  if (INPUT && !Exp::AnchorEnd().Matches(INPUT))
    throw ParserException(INPUT.mark(), alias ? ErrorMsg::CHAR_IN_ALIAS
                                              : ErrorMsg::CHAR_IN_ANCHOR);

  // and we're done
  Token token(alias ? Token::ALIAS : Token::ANCHOR, mark);
  token.value = name;
  m_tokens.push(token);
}